

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int cppcms_capi_session_set_binary(cppcms_capi_session *session,char *key,void *value,int length)

{
  invalid_argument *piVar1;
  string *psVar2;
  int in_ECX;
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  string *in_stack_ffffffffffffff68;
  session_interface *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff80;
  allocator *paVar3;
  cppcms_capi_session *in_stack_ffffffffffffff90;
  allocator local_59;
  string local_58 [52];
  int local_24;
  ulong local_20;
  char *local_18;
  long local_10;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    anon_unknown.dwarf_2860d0::check_str(in_stack_ffffffffffffff80);
    if (local_20 == 0) {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar1,"value is null");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (local_24 < 0) {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar1,"length is negative");
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    cppcms_capi_session::check_loaded_unsaved(in_stack_ffffffffffffff90);
    booster::hold_ptr<cppcms::session_interface>::operator*
              ((hold_ptr<cppcms::session_interface> *)(local_10 + 0x78));
    paVar3 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,local_18,paVar3);
    psVar2 = cppcms::session_interface::operator[]
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::assign((char *)psVar2,local_20);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cppcms_capi_session_set_binary(cppcms_capi_session *session,char const *key,void const *value,int length)
{
	TRY {
		if(!session)
			return -1;
		check_str(key);
		if(!value)
			throw std::invalid_argument("value is null");
		if(length < 0)
			throw std::invalid_argument("length is negative");
		session->check_loaded_unsaved();
		(*(session->p))[key].assign(static_cast<char const *>(value),size_t(length));
	}